

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::Generators::
Generators<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>
::populate(Generators<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>
           *this,unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>
                 *val)

{
  _Head_base<0UL,_Catch::Generators::IGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>_*,_false>
  local_20;
  IGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>
  *local_18;
  
  pf::
  make_unique<Catch::Generators::SingleValueGenerator<unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>,unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>
            ((pf *)&local_18,val);
  local_20._M_head_impl = local_18;
  std::
  vector<Catch::Generators::GeneratorWrapper<unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>,std::allocator<Catch::Generators::GeneratorWrapper<unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>>>
  ::
  emplace_back<Catch::Generators::GeneratorWrapper<unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>>
            ((vector<Catch::Generators::GeneratorWrapper<unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>,std::allocator<Catch::Generators::GeneratorWrapper<unary_op_tuple<std::__cxx11::string,trng::optimized_impl::uint128>>>>
              *)&this->m_generators,
             (GeneratorWrapper<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>
              *)&local_20);
  if (local_20._M_head_impl !=
      (IGenerator<unary_op_tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_trng::optimized_impl::uint128>_>
       *)0x0) {
    (*((local_20._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }